

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswCut.c
# Opt level: O0

int Csw_CutMergeOrdered(Csw_Man_t *p,Csw_Cut_t *pC0,Csw_Cut_t *pC1,Csw_Cut_t *pC)

{
  char cVar1;
  int local_3c;
  int local_38;
  int c;
  int k;
  int i;
  Csw_Cut_t *pC_local;
  Csw_Cut_t *pC1_local;
  Csw_Cut_t *pC0_local;
  Csw_Man_t *p_local;
  
  if (pC0->nFanins < pC1->nFanins) {
    __assert_fail("pC0->nFanins >= pC1->nFanins",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/csw/cswCut.c"
                  ,0x129,
                  "int Csw_CutMergeOrdered(Csw_Man_t *, Csw_Cut_t *, Csw_Cut_t *, Csw_Cut_t *)");
  }
  if (((int)pC0->nFanins == p->nLeafMax) && ((int)pC1->nFanins == p->nLeafMax)) {
    for (c = 0; c < pC0->nFanins; c = c + 1) {
      if (*(int *)((long)&pC0[1].pNext + (long)c * 4) != *(int *)((long)&pC1[1].pNext + (long)c * 4)
         ) {
        return 0;
      }
    }
    for (c = 0; c < pC0->nFanins; c = c + 1) {
      *(undefined4 *)((long)&pC[1].pNext + (long)c * 4) =
           *(undefined4 *)((long)&pC0[1].pNext + (long)c * 4);
    }
    pC->nFanins = pC0->nFanins;
    p_local._4_4_ = 1;
  }
  else if ((int)pC0->nFanins == p->nLeafMax) {
    for (c = 0; c < pC1->nFanins; c = c + 1) {
      local_38 = (int)pC0->nFanins;
      do {
        local_38 = local_38 + -1;
        if (local_38 < 0) break;
      } while (*(int *)((long)&pC0[1].pNext + (long)local_38 * 4) !=
               *(int *)((long)&pC1[1].pNext + (long)c * 4));
      if (local_38 == -1) {
        return 0;
      }
    }
    for (c = 0; c < pC0->nFanins; c = c + 1) {
      *(undefined4 *)((long)&pC[1].pNext + (long)c * 4) =
           *(undefined4 *)((long)&pC0[1].pNext + (long)c * 4);
    }
    pC->nFanins = pC0->nFanins;
    p_local._4_4_ = 1;
  }
  else {
    local_38 = 0;
    c = 0;
    for (local_3c = 0; cVar1 = (char)local_3c, local_3c < p->nLeafMax; local_3c = local_3c + 1) {
      if (local_38 == pC1->nFanins) {
        if (c == pC0->nFanins) {
          pC->nFanins = cVar1;
          return 1;
        }
        *(undefined4 *)((long)&pC[1].pNext + (long)local_3c * 4) =
             *(undefined4 *)((long)&pC0[1].pNext + (long)c * 4);
        c = c + 1;
      }
      else if (c == pC0->nFanins) {
        if (local_38 == pC1->nFanins) {
          pC->nFanins = cVar1;
          return 1;
        }
        *(undefined4 *)((long)&pC[1].pNext + (long)local_3c * 4) =
             *(undefined4 *)((long)&pC1[1].pNext + (long)local_38 * 4);
        local_38 = local_38 + 1;
      }
      else if (*(int *)((long)&pC0[1].pNext + (long)c * 4) <
               *(int *)((long)&pC1[1].pNext + (long)local_38 * 4)) {
        *(undefined4 *)((long)&pC[1].pNext + (long)local_3c * 4) =
             *(undefined4 *)((long)&pC0[1].pNext + (long)c * 4);
        c = c + 1;
      }
      else if (*(int *)((long)&pC1[1].pNext + (long)local_38 * 4) <
               *(int *)((long)&pC0[1].pNext + (long)c * 4)) {
        *(undefined4 *)((long)&pC[1].pNext + (long)local_3c * 4) =
             *(undefined4 *)((long)&pC1[1].pNext + (long)local_38 * 4);
        local_38 = local_38 + 1;
      }
      else {
        *(undefined4 *)((long)&pC[1].pNext + (long)local_3c * 4) =
             *(undefined4 *)((long)&pC0[1].pNext + (long)c * 4);
        local_38 = local_38 + 1;
        c = c + 1;
      }
    }
    if ((c < pC0->nFanins) || (local_38 < pC1->nFanins)) {
      p_local._4_4_ = 0;
    }
    else {
      pC->nFanins = cVar1;
      p_local._4_4_ = 1;
    }
  }
  return p_local._4_4_;
}

Assistant:

static inline int Csw_CutMergeOrdered( Csw_Man_t * p, Csw_Cut_t * pC0, Csw_Cut_t * pC1, Csw_Cut_t * pC )
{ 
    int i, k, c;
    assert( pC0->nFanins >= pC1->nFanins );
    // the case of the largest cut sizes
    if ( pC0->nFanins == p->nLeafMax && pC1->nFanins == p->nLeafMax )
    {
        for ( i = 0; i < pC0->nFanins; i++ )
            if ( pC0->pFanins[i] != pC1->pFanins[i] )
                return 0;
        for ( i = 0; i < pC0->nFanins; i++ )
            pC->pFanins[i] = pC0->pFanins[i];
        pC->nFanins = pC0->nFanins;
        return 1;
    }
    // the case when one of the cuts is the largest
    if ( pC0->nFanins == p->nLeafMax )
    {
        for ( i = 0; i < pC1->nFanins; i++ )
        {
            for ( k = pC0->nFanins - 1; k >= 0; k-- )
                if ( pC0->pFanins[k] == pC1->pFanins[i] )
                    break;
            if ( k == -1 ) // did not find
                return 0;
        }
        for ( i = 0; i < pC0->nFanins; i++ )
            pC->pFanins[i] = pC0->pFanins[i];
        pC->nFanins = pC0->nFanins;
        return 1;
    }

    // compare two cuts with different numbers
    i = k = 0;
    for ( c = 0; c < p->nLeafMax; c++ )
    {
        if ( k == pC1->nFanins )
        {
            if ( i == pC0->nFanins )
            {
                pC->nFanins = c;
                return 1;
            }
            pC->pFanins[c] = pC0->pFanins[i++];
            continue;
        }
        if ( i == pC0->nFanins )
        {
            if ( k == pC1->nFanins )
            {
                pC->nFanins = c;
                return 1;
            }
            pC->pFanins[c] = pC1->pFanins[k++];
            continue;
        }
        if ( pC0->pFanins[i] < pC1->pFanins[k] )
        {
            pC->pFanins[c] = pC0->pFanins[i++];
            continue;
        }
        if ( pC0->pFanins[i] > pC1->pFanins[k] )
        {
            pC->pFanins[c] = pC1->pFanins[k++];
            continue;
        }
        pC->pFanins[c] = pC0->pFanins[i++]; 
        k++;
    }
    if ( i < pC0->nFanins || k < pC1->nFanins )
        return 0;
    pC->nFanins = c;
    return 1;
}